

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlACatalogAdd(xmlCatalogPtr catal,xmlChar *type,xmlChar *orig,xmlChar *replace)

{
  xmlCatalogEntryType type_00;
  xmlCatalogEntryPtr userdata;
  xmlHashTablePtr pxVar1;
  xmlCatalogEntryPtr entry;
  xmlCatalogEntryType cattype;
  int res;
  xmlChar *replace_local;
  xmlChar *orig_local;
  xmlChar *type_local;
  xmlCatalogPtr catal_local;
  
  entry._4_4_ = -1;
  if (catal == (xmlCatalogPtr)0x0) {
    catal_local._4_4_ = -1;
  }
  else {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      entry._4_4_ = xmlAddXMLCatalog(catal->xml,type,orig,replace);
    }
    else {
      type_00 = xmlGetSGMLCatalogEntryType(type);
      if (type_00 != XML_CATA_NONE) {
        userdata = xmlNewCatalogEntry(type_00,orig,replace,(xmlChar *)0x0,XML_CATA_PREFER_NONE,
                                      (xmlCatalogEntryPtr)0x0);
        if (catal->sgml == (xmlHashTablePtr)0x0) {
          pxVar1 = xmlHashCreate(10);
          catal->sgml = pxVar1;
        }
        entry._4_4_ = xmlHashAddEntry(catal->sgml,orig,userdata);
      }
    }
    catal_local._4_4_ = entry._4_4_;
  }
  return catal_local._4_4_;
}

Assistant:

int
xmlACatalogAdd(xmlCatalogPtr catal, const xmlChar * type,
              const xmlChar * orig, const xmlChar * replace)
{
    int res = -1;

    if (catal == NULL)
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
        res = xmlAddXMLCatalog(catal->xml, type, orig, replace);
    } else {
        xmlCatalogEntryType cattype;

        cattype = xmlGetSGMLCatalogEntryType(type);
        if (cattype != XML_CATA_NONE) {
            xmlCatalogEntryPtr entry;

            entry = xmlNewCatalogEntry(cattype, orig, replace, NULL,
                                       XML_CATA_PREFER_NONE, NULL);
	    if (catal->sgml == NULL)
		catal->sgml = xmlHashCreate(10);
            res = xmlHashAddEntry(catal->sgml, orig, entry);
        }
    }
    return (res);
}